

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderSearch.h
# Opt level: O0

string * __thiscall HeaderSearch::operator()[abi_cxx11_(HeaderSearch *this,Token *token)

{
  string_view subtoken;
  bool bVar1;
  Page *__a;
  string *in_RDX;
  SearchBase *in_RSI;
  string *in_RDI;
  char *unaff_retaddr;
  string *in_stack_00000010;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  string *in_stack_000000e8;
  SearchBase *in_stack_000000f0;
  string transformedHtmlPage;
  Page *page;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> *in_stack_fffffffffffffe80;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_119;
  undefined4 local_118;
  allocator<char> local_112;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [32];
  undefined1 local_c8 [16];
  string *in_stack_ffffffffffffff48;
  string local_a0 [32];
  string local_80 [39];
  undefined1 local_59 [33];
  Page *local_38;
  string *in_stack_ffffffffffffffe0;
  undefined8 uVar2;
  
  if (*(int *)(in_RDX + 1) == 1) {
    __t = (basic_string_view<char,_std::char_traits<char>_> *)local_59;
    uVar2 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,(char *)__t,in_stack_fffffffffffffeb0);
    __a = SearchBase::getPage(in_stack_000000f0,in_stack_000000e8);
    std::__cxx11::string::~string((string *)(local_59 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_59);
    local_38 = __a;
    std::__cxx11::string::string(local_a0,(string *)&__a->content);
    replaceHtmlSymbols(in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_a0);
    local_c8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)in_RDX);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,(char *)__t,(allocator<char> *)__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,(char *)__t,(allocator<char> *)__a);
    subtoken._M_str = unaff_retaddr;
    subtoken._M_len = uVar2;
    SearchBase::findLinkToSubtoken
              (in_RSI,in_RDX,subtoken,in_stack_ffffffffffffffe0,in_stack_00000010);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    bVar1 = std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::has_value
                      ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)0x1bfac0)
    ;
    if (bVar1) {
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::value
                (in_stack_fffffffffffffe80);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                (in_stack_fffffffffffffec0,__t,(allocator<char> *)__a);
      std::allocator<char>::~allocator(&local_119);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffec0,(char *)__t,(allocator<char> *)__a);
      std::allocator<char>::~allocator(&local_112);
    }
    local_118 = 1;
    std::__cxx11::string::~string(local_80);
  }
  else {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffe7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe7);
  }
  return in_RDI;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::header) {
				return "";
			}


			Page* page = getPage("/w/cpp/header");
			const std::string transformedHtmlPage = replaceHtmlSymbols(page->content);
			const std::optional<std::string_view> link = findLinkToSubtoken(transformedHtmlPage, token.content, "<tt>", "</tt>");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}